

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitOrOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  char *pcVar1;
  uint64_t uVar2;
  int64_t iVar3;
  hugeint_t *idata_00;
  BitState<duckdb::hugeint_t> **states_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  hugeint_t local_d0;
  hugeint_t local_c0;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      idata_00 = *(hugeint_t **)(input + 0x20);
      states_00 = *(BitState<duckdb::hugeint_t> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::BitState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::BitOrOperation>
                (idata_00,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    pcVar1 = (char *)**(undefined8 **)(states + 0x20);
    local_c0.lower = **(uint64_t **)(input + 0x20);
    local_c0.upper = (*(uint64_t **)(input + 0x20))[1];
    if (*pcVar1 != '\0') {
      duckdb::hugeint_t::operator|=((hugeint_t *)(pcVar1 + 8),&local_c0);
      return;
    }
    *(uint64_t *)(pcVar1 + 8) = local_c0.lower;
    *(int64_t *)(pcVar1 + 0x10) = local_c0.upper;
    *pcVar1 = '\x01';
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_b0 == 0) {
    if (count != 0) {
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        if (*(long *)local_c0.lower != 0) {
          uVar4 = (ulong)*(uint *)(*(long *)local_c0.lower + uVar6 * 4);
        }
        uVar5 = uVar6;
        if (*local_78 != 0) {
          uVar5 = (ulong)*(uint *)(*local_78 + uVar6 * 4);
        }
        pcVar1 = *(char **)(local_70 + uVar5 * 8);
        uVar2 = *(uint64_t *)(local_c0.upper + uVar4 * 0x10);
        iVar3 = *(int64_t *)(local_c0.upper + 8 + uVar4 * 0x10);
        if (*pcVar1 == '\0') {
          *(uint64_t *)(pcVar1 + 8) = uVar2;
          *(int64_t *)(pcVar1 + 0x10) = iVar3;
          *pcVar1 = '\x01';
        }
        else {
          local_d0.lower = uVar2;
          local_d0.upper = iVar3;
          duckdb::hugeint_t::operator|=((hugeint_t *)(pcVar1 + 8),&local_d0);
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
  }
  else if (count != 0) {
    uVar6 = 0;
    do {
      uVar4 = uVar6;
      if (*(long *)local_c0.lower != 0) {
        uVar4 = (ulong)*(uint *)(*(long *)local_c0.lower + uVar6 * 4);
      }
      uVar5 = uVar6;
      if (*local_78 != 0) {
        uVar5 = (ulong)*(uint *)(*local_78 + uVar6 * 4);
      }
      if ((local_b0 == 0) || ((*(ulong *)(local_b0 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0))
      {
        pcVar1 = *(char **)(local_70 + uVar5 * 8);
        uVar2 = *(uint64_t *)(local_c0.upper + uVar4 * 0x10);
        iVar3 = *(int64_t *)(local_c0.upper + 8 + uVar4 * 0x10);
        if (*pcVar1 == '\0') {
          *(uint64_t *)(pcVar1 + 8) = uVar2;
          *(int64_t *)(pcVar1 + 0x10) = iVar3;
          *pcVar1 = '\x01';
        }
        else {
          local_d0.lower = uVar2;
          local_d0.upper = iVar3;
          duckdb::hugeint_t::operator|=((hugeint_t *)(pcVar1 + 8),&local_d0);
        }
      }
      uVar6 = uVar6 + 1;
    } while (count != uVar6);
  }
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
  }
  if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}